

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this;
  char *__s;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  int *piVar9;
  mz_ulong __n;
  reference src;
  uint *puVar10;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar11;
  reference pvVar12;
  reference pvVar13;
  unsigned_long_long *val_00;
  reference pvVar14;
  iterator __first;
  iterator __last;
  uchar *puVar15;
  long lVar16;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3a8;
  const_iterator local_3a0;
  uchar *local_398;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_390;
  const_iterator local_388;
  uchar *local_380;
  uchar *local_378;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_370;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_368;
  const_iterator local_360;
  int local_354;
  iterator iStack_350;
  int i_2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_348;
  uchar *local_340;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_338;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_330;
  const_iterator local_328;
  uchar *local_320;
  uchar *local_318;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_310;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_308;
  const_iterator local_300;
  uint local_2f8;
  allocator<unsigned_char> local_2f1;
  uint dataLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_1;
  unsigned_long_long outSize;
  undefined1 local_2c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  uint *linePtr_4;
  int local_2a0;
  uint val_2;
  int x_4;
  int y_4;
  float *linePtr_3;
  int local_288;
  float val_1;
  int x_3;
  int y_3;
  unsigned_short *linePtr_2;
  FP16 local_270;
  FP32 local_26c;
  FP16 h16_1;
  FP32 f32_1;
  int x_2;
  int y_2;
  unsigned_short *linePtr_1;
  int local_250;
  int iStack_24c;
  unsigned_short val;
  int x_1;
  int y_1;
  float *linePtr;
  FP32 local_238;
  FP16 local_234;
  FP32 f32;
  FP16 h16;
  int x;
  int y;
  int c_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  int h;
  int endY;
  int startY;
  int i_1;
  int c_1;
  size_t channelOffset;
  int pixelDataSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  undefined1 local_1c0 [8];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  undefined1 local_1a0 [7];
  bool isBigEndian;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  longlong offset;
  size_t headerSize;
  undefined1 local_170 [8];
  vector<long_long,_std::allocator<long_long>_> offsets;
  int numBlocks;
  float fStack_14c;
  uchar e;
  int i;
  float w;
  float center [2];
  float aspectRatio;
  uint uStack_134;
  uchar lineOrder;
  int data_2 [4];
  int compressionType;
  undefined1 local_100 [8];
  ChannelInfo info;
  undefined1 local_c8 [4];
  int c;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  int numScanlineBlocks;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  const_iterator local_80;
  char local_74 [4];
  iterator iStack_70;
  char marker [4];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  const_iterator local_50;
  char local_44 [4];
  undefined1 local_40 [4];
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  char **err_local;
  uchar **memory_out_local;
  EXRImage *exrImage_local;
  
  if ((exrImage == (EXRImage *)0x0) || (memory_out == (uchar **)0x0)) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    exrImage_local = (EXRImage *)0xffffffffffffffff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    builtin_strncpy(local_44,"v/1\x01",4);
    local_58._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_50,&local_58);
    iStack_70 = std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,local_50,
                           local_44,local_40);
    local_74[0] = '\x02';
    local_74[1] = '\0';
    local_74[2] = '\0';
    local_74[3] = '\0';
    local_88._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_80,&local_88);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,local_80,local_74,
               (char *)&stack0xffffffffffffff90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &channels.
                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              *)local_c8);
    for (info.ySampling = 0; info.ySampling < exrImage->num_channels;
        info.ySampling = info.ySampling + 1) {
      anon_unknown.dwarf_13fc48::anon_struct_48_5_91bcb76e::ChannelInfo
                ((anon_struct_48_5_91bcb76e *)local_100);
      info.name.field_2._M_local_buf[0xc] = '\0';
      info.name.field_2._8_4_ = exrImage->requested_pixel_types[info.ySampling];
      info.pixelType = 1;
      info.pLinear = '\x01';
      info._37_3_ = 0;
      __s = exrImage->channel_names[info.ySampling];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compressionType,__s,(allocator<char> *)((long)data_2 + 0xf));
      std::__cxx11::string::operator=((string *)local_100,(string *)&compressionType);
      std::__cxx11::string::~string((string *)&compressionType);
      std::allocator<char>::~allocator((allocator<char> *)((long)data_2 + 0xf));
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)local_c8,(value_type *)local_100);
      anon_unknown.dwarf_13fc48::anon_struct_48_5_91bcb76e::~ChannelInfo
                ((anon_struct_48_5_91bcb76e *)local_100);
    }
    anon_unknown.dwarf_13fc48::WriteChannelInfo
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &channels.
                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                *)local_c8);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &channels.
                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &channels.
                        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"channels","chlist"
               ,pvVar6,(int)sVar7);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *)local_c8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &channels.
                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    data_2[2] = 3;
    bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_13fc48::swap4((uint *)(data_2 + 2));
    }
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"compression",
               "compression",(uchar *)(data_2 + 2),1);
    aspectRatio = 0.0;
    uStack_134 = 0;
    data_2[0] = exrImage->width + -1;
    data_2[1] = exrImage->height + -1;
    bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_13fc48::swap4((uint *)&aspectRatio);
      anon_unknown.dwarf_13fc48::swap4(&stack0xfffffffffffffecc);
      anon_unknown.dwarf_13fc48::swap4((uint *)data_2);
      anon_unknown.dwarf_13fc48::swap4((uint *)(data_2 + 1));
    }
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"dataWindow",
               "box2i",(uchar *)&aspectRatio,0x10);
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"displayWindow",
               "box2i",(uchar *)&aspectRatio,0x10);
    center[1]._3_1_ = 0;
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"lineOrder",
               "lineOrder",(uchar *)((long)center + 7),1);
    center[0] = 1.0;
    bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_13fc48::swap4((uint *)center);
    }
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"pixelAspectRatio",
               "float",(uchar *)center,4);
    _i = 0;
    bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_13fc48::swap4((uint *)&i);
      anon_unknown.dwarf_13fc48::swap4((uint *)&w);
    }
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
               "screenWindowCenter","v2f",(uchar *)&i,8);
    fStack_14c = (float)exrImage->width;
    bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
    if (bVar2) {
      anon_unknown.dwarf_13fc48::swap4((uint *)&stack0xfffffffffffffeb4);
    }
    anon_unknown.dwarf_13fc48::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,"screenWindowWidth"
               ,"float",(uchar *)&stack0xfffffffffffffeb4,4);
    if (0 < exrImage->num_custom_attributes) {
      printf("custom\n");
      for (numBlocks = 0; numBlocks < exrImage->num_custom_attributes; numBlocks = numBlocks + 1) {
        lVar16 = (long)numBlocks;
        anon_unknown.dwarf_13fc48::WriteAttributeToMemory
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                   exrImage->custom_attributes[lVar16].name,exrImage->custom_attributes[lVar16].type
                   ,(uchar *)&exrImage->custom_attributes[lVar16].value,
                   exrImage->custom_attributes[lVar16].size);
      }
    }
    offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
               (value_type_conflict3 *)
               ((long)&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = exrImage->height / 0x10;
    if ((int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage * 0x10 < exrImage->height) {
      offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
    }
    sVar7 = (size_type)
            (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    std::allocator<long_long>::allocator((allocator<long_long> *)((long)&headerSize + 7));
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_170,sVar7,
               (allocator<long_long> *)((long)&headerSize + 7));
    std::allocator<long_long>::~allocator((allocator<long_long> *)((long)&headerSize + 7));
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(sVar7 + (long)(int)offsets.
                                      super__Vector_base<long_long,_std::allocator<long_long>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage * 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
    dataList.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         anon_unknown.dwarf_13fc48::IsBigEndian();
    sVar7 = (size_type)
            (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    this = (allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
           ((long)&channelOffsetList.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator(this);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_1c0,sVar7,this);
    std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
              ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               ((long)&channelOffsetList.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    iVar3 = exrImage->num_channels;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&channelOffset + 7))
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pixelDataSize,(long)iVar3,
               (allocator<unsigned_long> *)((long)&channelOffset + 7));
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)((long)&channelOffset + 7));
    channelOffset._0_4_ = 0;
    _i_1 = 0;
    for (startY = 0; startY < exrImage->num_channels; startY = startY + 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pixelDataSize,
                          (long)startY);
      *pvVar8 = _i_1;
      if (exrImage->requested_pixel_types[startY] == 1) {
        channelOffset._0_4_ = (int)channelOffset + 2;
        _i_1 = _i_1 + 2;
      }
      else {
        if ((exrImage->requested_pixel_types[startY] != 2) &&
           (exrImage->requested_pixel_types[startY] != 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x26f0,
                        "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                       );
        }
        channelOffset._0_4_ = (int)channelOffset + 4;
        _i_1 = _i_1 + 4;
      }
    }
    for (endY = 0;
        endY < (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage; endY = endY + 1) {
      iVar3 = endY * 0x10;
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (endY + 1) * 0x10;
      piVar9 = std::min<int>((int *)((long)&buf.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             &exrImage->height);
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *piVar9 + endY * -0x10;
      iVar4 = exrImage->width *
              (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage * (int)channelOffset;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&y + 3));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,(long)iVar4,
                 (allocator<unsigned_char> *)((long)&y + 3));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&y + 3));
      for (x = 0; x < exrImage->num_channels; x = x + 1) {
        if (exrImage->pixel_types[x] == 1) {
          if (exrImage->requested_pixel_types[x] == 2) {
            for (h16 = (FP16)0x0;
                (int)h16 <
                (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; h16.s = h16.s + 1) {
              for (f32.u = 0; (int)f32.u < exrImage->width; f32.u = f32.u + 1) {
                local_234.u = *(undefined2 *)
                               (exrImage->images[x] +
                               (long)(int)(((int)h16 + iVar3) * exrImage->width + f32.u) * 2);
                linePtr._4_4_ = local_234;
                local_238 = anon_unknown.dwarf_13fc48::half_to_float(local_234);
                if ((dataList.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                  anon_unknown.dwarf_13fc48::swap4(&local_238.u);
                }
                iVar5 = (int)channelOffset * (int)h16;
                iVar4 = exrImage->width;
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &pixelDataSize,(long)x);
                _x_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,
                                  (long)(iVar5 * iVar4) + *pvVar8 * (long)exrImage->width);
                *(FP32 *)(_x_1 + (long)(int)f32.u * 4) = local_238;
              }
            }
          }
          else {
            if (exrImage->requested_pixel_types[x] != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x2728,
                            "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                           );
            }
            for (iStack_24c = 0;
                iStack_24c <
                (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; iStack_24c = iStack_24c + 1) {
              for (local_250 = 0; local_250 < exrImage->width; local_250 = local_250 + 1) {
                linePtr_1._6_2_ =
                     *(undefined2 *)
                      (exrImage->images[x] +
                      (long)((iStack_24c + iVar3) * exrImage->width + local_250) * 2);
                if ((dataList.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                  anon_unknown.dwarf_13fc48::swap2((unsigned_short *)((long)&linePtr_1 + 6));
                }
                iVar5 = (int)channelOffset * iStack_24c;
                iVar4 = exrImage->width;
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &pixelDataSize,(long)x);
                _x_2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,
                                  (long)(iVar5 * iVar4) + *pvVar8 * (long)exrImage->width);
                *(undefined2 *)(_x_2 + (long)local_250 * 2) = linePtr_1._6_2_;
              }
            }
          }
        }
        else if (exrImage->pixel_types[x] == 2) {
          if (exrImage->requested_pixel_types[x] == 1) {
            for (f32_1.u = 0;
                (int)f32_1.u <
                (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; f32_1.u = f32_1.u + 1) {
              for (h16_1 = (FP16)0x0; (int)h16_1 < exrImage->width; h16_1.s = h16_1.s + 1) {
                linePtr_2._0_4_ =
                     *(FP32 *)(exrImage->images[x] +
                              (long)(int)((f32_1.u + iVar3) * exrImage->width + (int)h16_1) * 4);
                local_26c = linePtr_2._0_4_;
                linePtr_2._4_4_ = anon_unknown.dwarf_13fc48::float_to_half_full(linePtr_2._0_4_);
                local_270 = linePtr_2._4_4_;
                if ((dataList.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                  anon_unknown.dwarf_13fc48::swap2(&local_270.u);
                }
                iVar5 = (int)channelOffset * f32_1.u;
                iVar4 = exrImage->width;
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &pixelDataSize,(long)x);
                _x_3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,
                                  (long)(iVar5 * iVar4) + *pvVar8 * (long)exrImage->width);
                *(unsigned_short *)(_x_3 + (long)(int)h16_1 * 2) = local_270.u;
              }
            }
          }
          else {
            if (exrImage->requested_pixel_types[x] != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x2755,
                            "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                           );
            }
            for (val_1 = 0.0;
                (int)val_1 <
                (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; val_1 = (float)((int)val_1 + 1)) {
              for (local_288 = 0; local_288 < exrImage->width; local_288 = local_288 + 1) {
                linePtr_3._4_4_ =
                     *(undefined4 *)
                      (exrImage->images[x] +
                      (long)(((int)val_1 + iVar3) * exrImage->width + local_288) * 4);
                if ((dataList.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                  anon_unknown.dwarf_13fc48::swap4((uint *)((long)&linePtr_3 + 4));
                }
                iVar5 = (int)channelOffset * (int)val_1;
                iVar4 = exrImage->width;
                pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    &pixelDataSize,(long)x);
                _x_4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,
                                  (long)(iVar5 * iVar4) + *pvVar8 * (long)exrImage->width);
                *(undefined4 *)(_x_4 + (long)local_288 * 4) = linePtr_3._4_4_;
              }
            }
          }
        }
        else if (exrImage->pixel_types[x] == 0) {
          for (val_2 = 0;
              (int)val_2 <
              (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage; val_2 = val_2 + 1) {
            for (local_2a0 = 0; local_2a0 < exrImage->width; local_2a0 = local_2a0 + 1) {
              linePtr_4._4_4_ =
                   *(undefined4 *)
                    (exrImage->images[x] +
                    (long)(int)((val_2 + iVar3) * exrImage->width + local_2a0) * 4);
              if ((dataList.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
                anon_unknown.dwarf_13fc48::swap4((uint *)((long)&linePtr_4 + 4));
              }
              iVar5 = (int)channelOffset * val_2;
              iVar4 = exrImage->width;
              pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &pixelDataSize,(long)x);
              block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,
                              (long)(iVar5 * iVar4) + *pvVar8 * (long)exrImage->width);
              *(undefined4 *)
               (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + (long)local_2a0 * 4) = linePtr_4._4_4_;
            }
          }
        }
      }
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
      __n = mz_compressBound(sVar7);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&outSize + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c8,__n,
                 (allocator<unsigned_char> *)((long)&outSize + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&outSize + 7));
      header_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c8);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c8,0);
      src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2,0);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
      anon_unknown.dwarf_13fc48::CompressZip
                (pvVar6,(unsigned_long_long *)
                        &header_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,src,sVar7);
      std::allocator<unsigned_char>::allocator(&local_2f1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataLen,8,&local_2f1);
      std::allocator<unsigned_char>::~allocator(&local_2f1);
      local_2f8 = (uint)header_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
      piVar9 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataLen,0
                                );
      *piVar9 = iVar3;
      puVar10 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataLen
                                   ,4);
      *puVar10 = local_2f8;
      bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
      if (bVar2) {
        puVar10 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &dataLen,0);
        anon_unknown.dwarf_13fc48::swap4(puVar10);
        puVar10 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &dataLen,4);
        anon_unknown.dwarf_13fc48::swap4(puVar10);
      }
      pvVar11 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)endY);
      pvVar12 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)endY);
      local_308._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar12);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_300,&local_308);
      local_310._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataLen);
      local_318 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &dataLen);
      local_320 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     (pvVar11,local_300,local_310,
                                      (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )local_318);
      pvVar11 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)endY);
      pvVar12 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)endY);
      local_330._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar12);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_328,&local_330);
      local_338._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c8);
      local_348._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c8);
      local_340 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(&local_348,(ulong)local_2f8);
      iStack_350 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
                   insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                             (pvVar11,local_328,local_338,
                              (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )local_340);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dataLen);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2c8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&c_2);
    }
    for (local_354 = 0;
        local_354 <
        (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_354 = local_354 + 1) {
      local_368._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_360,&local_368);
      pvVar12 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)local_354);
      local_370._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar12);
      pvVar12 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)local_354);
      local_378 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar12);
      local_380 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                      local_1a0,local_360,local_370,
                                      (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )local_378);
      puVar1 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pvVar13 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                          ((vector<long_long,_std::allocator<long_long>_> *)local_170,
                           (long)local_354);
      *pvVar13 = (value_type)puVar1;
      bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
      if (bVar2) {
        val_00 = (unsigned_long_long *)
                 std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           ((vector<long_long,_std::allocator<long_long>_> *)local_170,
                            (long)local_354);
        anon_unknown.dwarf_13fc48::swap8(val_00);
      }
      pvVar12 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_1c0,(long)local_354);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar12);
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + sVar7;
    }
    local_390._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_388,&local_390);
    pvVar13 = std::vector<long_long,_std::allocator<long_long>_>::at
                        ((vector<long_long,_std::allocator<long_long>_> *)local_170,0);
    pvVar14 = std::vector<long_long,_std::allocator<long_long>_>::at
                        ((vector<long_long,_std::allocator<long_long>_> *)local_170,0);
    local_398 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                         insert<unsigned_char*,void>
                                   ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,
                                    local_388,(uchar *)pvVar13,
                                    (uchar *)(pvVar14 +
                                             (int)offsets.
                                                  super__Vector_base<long_long,_std::allocator<long_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             ));
    local_3a8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_3a0,&local_3a8);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,local_3a0,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    if (sVar7 == 0) {
      __assert_fail("memory.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0x27a2,
                    "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                   );
    }
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    puVar15 = (uchar *)malloc(sVar7);
    *memory_out = puVar15;
    puVar15 = *memory_out;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    memcpy(puVar15,pvVar6,sVar7);
    exrImage_local =
         (EXRImage *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pixelDataSize);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_1c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
    std::vector<long_long,_std::allocator<long_long>_>::~vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_170);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  return (size_t)exrImage_local;
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlineBlocks =
      16; // 1 for no compress & ZIPS, 16 for ZIP compression.

  // Write attributes.
  {
    std::vector<unsigned char> data;

    std::vector<ChannelInfo> channels;
    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int compressionType = 3; // ZIP compression
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&compressionType));
    }
    WriteAttributeToMemory(
        memory, "compression", "compression",
        reinterpret_cast<const unsigned char *>(&compressionType), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    printf("custom\n");
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name, exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(&exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
        
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlineBlocks * i;
    int endY = (std::min)(numScanlineBlocks * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
    unsigned long long outSize = block.size();

    CompressZip(&block.at(0), outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size());

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    std::vector<unsigned char> header(8);
    unsigned int dataLen = outSize; // truncate
    memcpy(&header.at(0), &startY, sizeof(int));
    memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
      swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
    }

    dataList[i].insert(dataList[i].end(), header.begin(), header.end());
    dataList[i].insert(dataList[i].end(), block.begin(),
                       block.begin() + dataLen);

    // data.insert(data.end(), header.begin(), header.end());
    // data.insert(data.end(), block.begin(), block.begin() + dataLen);

    // offsets[i] = offset;
    // if (IsBigEndian()) {
    //  swap8(reinterpret_cast<unsigned long long*>(&offsets[i]));
    //}
    // offset += dataLen + 8; // 8 = sizeof(blockHeader)
  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}